

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

_Bool quest_monster_death_check(player *p,monster *mon)

{
  uint32_t *puVar1;
  level_conflict *plVar2;
  _Bool _Var3;
  wchar_t wVar4;
  quest *quest;
  quest_place *pqVar5;
  wchar_t *pwVar6;
  level_conflict *plVar7;
  char *pcVar8;
  wchar_t wVar9;
  ulong uVar10;
  ulong uVar11;
  wchar_t place;
  ulong uVar12;
  loc lVar13;
  loc lVar14;
  bool bVar15;
  loc local_58;
  ulong local_50;
  player *local_48;
  ulong local_40;
  level_conflict *local_38;
  
  place = (wchar_t)p->place;
  quest = find_quest(place);
  if (((quest == (quest *)0x0) || (mon->race != quest->race)) || (quest->complete != false)) {
    return false;
  }
  wVar4 = quest->cur_num + L'\x01';
  quest->cur_num = wVar4;
  if (wVar4 < quest->max_num) goto LAB_001b1a79;
  pqVar5 = find_quest_place(quest);
  quest->complete = true;
  if (pqVar5->block == true) {
    lVar14.x = (mon->grid).x;
    lVar14.y = (mon->grid).y;
    uVar10 = (ulong)lVar14 >> 0x20;
    plVar2 = world->levels;
    local_58 = lVar14;
    local_48 = p;
    if (plVar2[place].down != (char *)0x0) {
      while( true ) {
        lVar13 = (loc)((ulong)lVar14 & 0xffffffff | uVar10 << 0x20);
        _Var3 = square_changeable(cave,lVar13);
        if (((_Var3) || (_Var3 = square_ispassable(cave,lVar13), !_Var3)) ||
           (_Var3 = square_isdoor(cave,lVar13), _Var3)) break;
        scatter(cave,&local_58,lVar13,L'\x01',false);
        lVar14 = (loc)((ulong)local_58 & 0xffffffff);
        uVar10 = (ulong)local_58 >> 0x20;
      }
      push_object(lVar13);
      msg("A magical staircase appears...");
      square_set_feat(cave,lVar13,FEAT_MORE);
      puVar1 = &local_48->upkeep->update;
      *puVar1 = *puVar1 | 0xc0;
    }
    uVar12 = (ulong)lVar14 & 0xffffffff;
    bVar15 = plVar2[place].north != (char *)0x0;
    local_50 = uVar10;
    if (bVar15) {
      local_38 = level_by_name(world,plVar2[place].north);
      local_40 = 1;
      if ((int)uVar10 < 1) {
        local_40 = uVar10;
      }
      lVar13 = (loc)(uVar10 << 0x20 | uVar12);
      while ((uVar11 = local_40, 1 < (int)uVar10 &&
             (_Var3 = square_ispermanent(cave,lVar13), uVar11 = uVar10, !_Var3))) {
        square_set_feat(cave,lVar13,FEAT_ROAD);
        lVar13 = (loc)((long)lVar13 + -0x100000000);
        uVar10 = (ulong)((int)uVar10 - 1);
      }
      uVar10 = local_50;
      if (plVar2[place].depth < local_38->depth) {
        pwVar6 = &FEAT_MORE_NORTH;
      }
      else {
        pwVar6 = &FEAT_LESS_NORTH;
      }
      square_set_feat(cave,(loc)(uVar11 << 0x20 | uVar12),*pwVar6);
    }
    if (plVar2[place].east != (char *)0x0) {
      plVar7 = level_by_name(world,plVar2[place].east);
      uVar11 = (ulong)lVar14 & 0xffffffff;
      while( true ) {
        lVar13 = (loc)(uVar11 | uVar10 << 0x20);
        if ((cave->width + -2 <= (int)uVar11) || (_Var3 = square_ispermanent(cave,lVar13), _Var3))
        break;
        square_set_feat(cave,lVar13,FEAT_ROAD);
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      uVar10 = local_50;
      if (plVar2[place].depth < plVar7->depth) {
        pwVar6 = &FEAT_MORE_EAST;
      }
      else {
        pwVar6 = &FEAT_LESS_EAST;
      }
      square_set_feat(cave,lVar13,*pwVar6);
      bVar15 = true;
    }
    if (plVar2[place].south == (char *)0x0) {
      pcVar8 = plVar2[place].west;
      if (pcVar8 != (char *)0x0) goto LAB_001b19af;
      p = local_48;
      if (bVar15) goto LAB_001b1a50;
    }
    else {
      plVar7 = level_by_name(world,plVar2[place].south);
      uVar11 = uVar10 & 0xffffffff;
      while( true ) {
        lVar13 = (loc)(uVar11 << 0x20 | uVar12);
        if ((cave->height + -2 <= (int)uVar11) || (_Var3 = square_ispermanent(cave,lVar13), _Var3))
        break;
        square_set_feat(cave,lVar13,FEAT_ROAD);
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      if (plVar2[place].depth < plVar7->depth) {
        pwVar6 = &FEAT_MORE_SOUTH;
      }
      else {
        pwVar6 = &FEAT_LESS_SOUTH;
      }
      square_set_feat(cave,lVar13,*pwVar6);
      pcVar8 = plVar2[place].west;
      if (pcVar8 != (char *)0x0) {
LAB_001b19af:
        plVar7 = level_by_name(world,pcVar8);
        wVar4 = L'\x01';
        if (lVar14.x < L'\x01') {
          wVar4 = lVar14.x;
        }
        for (; wVar9 = wVar4, L'\x01' < (wchar_t)uVar12; uVar12 = uVar12 - 1) {
          lVar14 = (loc)((uVar10 << 0x20) + uVar12);
          _Var3 = square_ispermanent(cave,lVar14);
          wVar9 = (wchar_t)uVar12;
          if (_Var3) break;
          square_set_feat(cave,lVar14,FEAT_ROAD);
        }
        if (plVar2[place].depth < plVar7->depth) {
          pwVar6 = &FEAT_MORE_WEST;
        }
        else {
          pwVar6 = &FEAT_LESS_WEST;
        }
        square_set_feat(cave,(loc)(uVar10 << 0x20 | (ulong)(uint)wVar9),*pwVar6);
      }
LAB_001b1a50:
      pcVar8 = locality_name(plVar2[place].locality);
      msg("The way out of %s is revealed!",pcVar8);
      p = local_48;
    }
  }
  puVar1 = &p->upkeep->update;
  *puVar1 = *puVar1 | 0x20;
LAB_001b1a79:
  if ((quest->type == L'\x03') && (quest->complete == true)) {
    p->total_winner = 1;
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 2;
    msg("*** CONGRATULATIONS ***");
    msg("You have won the game!");
    msg("You may retire (key is shift-q) when you are ready.");
  }
  return true;
}

Assistant:

bool quest_monster_death_check(struct player *p, const struct monster *mon)
{
	struct quest *quest = find_quest(p->place);

	/* Simple checks */
	if (!quest) return false;
	if ((mon->race != quest->race) || quest->complete) return false;

	/* Increment count, check for completion */
	quest->cur_num++;
	if (quest->cur_num >= quest->max_num) {
		struct quest_place *place = find_quest_place(quest);
		quest->complete = true;

		/* Build magical stairs if needed */
		if (place->block) {
			build_quest_stairs(p, mon->grid);
		}

		/* Check specialties */
		p->upkeep->update |= (PU_SPECIALTY);
	}

	/* Game over... */
	if ((quest->type == QUEST_FINAL) && quest->complete) {
		p->total_winner = true;
		p->upkeep->redraw |= (PR_TITLE);
		msg("*** CONGRATULATIONS ***");
		msg("You have won the game!");
		msg("You may retire (key is shift-q) when you are ready.");
	}

	return true;
}